

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O1

int __thiscall
AbstractModuleClient::processCommandMsg(AbstractModuleClient *this,string *cmdType,TrodesMsg *msg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  network_pimpl *this_00;
  _Alloc_hider __s1;
  int iVar2;
  string type;
  uint32_t timestamp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  long *local_c0 [2];
  long local_b0 [2];
  string local_a0;
  long *local_80 [2];
  long local_70 [2];
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  iVar2 = std::__cxx11::string::compare((char *)cmdType);
  if (iVar2 == 0) {
    (*(this->super_MlmWrap)._vptr_MlmWrap[0xd])(this);
    return 0;
  }
  iVar2 = std::__cxx11::string::compare((char *)cmdType);
  if (iVar2 == 0) {
    TrodesMsg::popstr_abi_cxx11_(&local_100,msg);
    __s1._M_p = local_100._M_dataplus._M_p;
    iVar2 = strcmp(local_100._M_dataplus._M_p,"_fopen");
    if (iVar2 == 0) {
      TrodesMsg::popstr_abi_cxx11_(&local_e0,msg);
      network_pimpl::setTrodes_filename((this->super_MlmWrap).state,&local_e0);
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
      (*(this->super_MlmWrap)._vptr_MlmWrap[9])(this,local_40);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar2 = strcmp(__s1._M_p,"_fclose");
      if (iVar2 == 0) {
        this_00 = (this->super_MlmWrap).state;
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
        network_pimpl::setTrodes_filename(this_00,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        (*(this->super_MlmWrap)._vptr_MlmWrap[10])(this);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == &local_100.field_2) {
      return 0;
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)cmdType);
    if (iVar2 == 0) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"i","");
      TrodesMsg::popcontents<int>(msg,&local_60,(int *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      paVar1 = &local_100.field_2;
      local_100._M_string_length = 0;
      local_100.field_2._M_local_buf[0] = '\0';
      local_100._M_dataplus._M_p = (pointer)paVar1;
      if (((ulong)local_e0._M_dataplus._M_p & 0xffffffff) < 7) {
        std::__cxx11::string::operator=
                  ((string *)&local_100,
                   &DAT_00283510 +
                   *(int *)(&DAT_00283510 + ((ulong)local_e0._M_dataplus._M_p & 0xffffffff) * 4));
      }
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,local_100._M_dataplus._M_p,
                 local_100._M_dataplus._M_p + local_100._M_string_length);
      (*(this->super_MlmWrap)._vptr_MlmWrap[0xc])(this,local_80);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p == paVar1) {
        return 0;
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)cmdType);
      if (iVar2 != 0) {
        return 0;
      }
      local_100._M_string_length = 0;
      local_100.field_2._M_local_buf[0] = '\0';
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"s4","");
      TrodesMsg::popcontents<std::__cxx11::string,unsigned_int>
                (msg,&local_a0,&local_100,(uint *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c0,local_100._M_dataplus._M_p,
                 local_100._M_dataplus._M_p + local_100._M_string_length);
      (*(this->super_MlmWrap)._vptr_MlmWrap[0xb])
                (this,local_c0,(ulong)local_e0._M_dataplus._M_p & 0xffffffff);
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0],local_b0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p == &local_100.field_2) {
        return 0;
      }
    }
  }
  operator_delete(local_100._M_dataplus._M_p,
                  CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                           local_100.field_2._M_local_buf[0]) + 1);
  return 0;
}

Assistant:

int AbstractModuleClient::processCommandMsg(std::string cmdType, TrodesMsg &msg) {
    int rc = 0;
    if (cmdType == quit_CMD) {
        // std::cout << "Client " << id << " got quit command.\n";
        recv_quit();
    }
    else if(cmdType == file_CMD){
        //Call user defined file commands
        std::string op = msg.popstr();
        if(streq(op.c_str(), file_OPEN)){
            std::string file = msg.popstr();
            state->setTrodes_filename(file);
            recv_file_open(file);
        }
        else if(streq(op.c_str(), file_CLOSE)){
            state->setTrodes_filename("");
            recv_file_close();
        }
    }
    else if(cmdType == source_CMD){
        int src;
        msg.popcontents("i", src);
        std::string src_string;
        switch (src) {
        case None:
            src_string = "None";
            break;
        case Fake:
            src_string = "Generator";
            break;
        case FakeSpikes:
            src_string = "Spikes Generator";
            break;
        case File:
            src_string = "File";
            break;
        case Ethernet:
            src_string = "Ethernet";
            break;
        case USBDAQ:
            src_string = "USB";
            break;
        case Rhythm:
            src_string = "Rhythm";
            break;
        default:
            break;
        }
        // std::cerr << "got source " << src_string << "\n";
        recv_source(src_string);
    }
    else if(cmdType == acquisition_CMD){
        std::string type;
        uint32_t timestamp;
        msg.popcontents("s4",type,timestamp);
        recv_acquisition(type, timestamp);
    }
    // else{
    //     std::cout << "[AMC]: Trodes Command [" << cmdType << "] not recognized.\n";
    // }
    return rc;
}